

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::Equals<char[13],std::__cxx11::string>
          (Assert *this,string *msg,char (*expected) [13],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  uint *puVar1;
  __type _Var2;
  ostream *poVar3;
  ostringstream s;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Assert *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  std::__cxx11::string::string((string *)local_1a8,*expected,(allocator *)&local_1b8);
  local_1c0 = this;
  std::__cxx11::string::string((string *)&local_1e0,(string *)actual);
  _Var2 = std::operator==(local_1a8,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1a8);
  if (_Var2) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (msg->_M_string_length != 0) {
    local_1e0._M_dataplus._M_p = (pointer)msg;
    poVar3 = details::operator<<((ostream *)local_1a8,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1e0);
    std::operator<<(poVar3," ");
  }
  puVar1 = (uint *)((long)&local_1a8[0].field_2 +
                   *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar1 = *puVar1 | 1;
  std::operator<<((ostream *)local_1a8,"\n");
  poVar3 = std::operator<<((ostream *)local_1a8,"    Expected <");
  std::__cxx11::string::string((string *)&local_1e0,*expected,&local_1e1);
  local_1b8 = &local_1e0;
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected;
  poVar3 = details::streamit<std::__cxx11::string,char[13]>(poVar3);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  poVar3 = std::operator<<((ostream *)local_1a8,"     but got <");
  std::__cxx11::string::string((string *)&local_1e0,(string *)actual);
  local_1b8 = &local_1e0;
  local_1b0 = actual;
  poVar3 = details::streamit<std::__cxx11::string,std::__cxx11::string>(poVar3);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::operator<<((ostream *)local_1a8,"  ");
  std::__cxx11::stringbuf::str();
  Error(local_1c0,&local_1e0);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }